

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::GetLocalHostName
          (RTPUDPv6Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  reference pbVar5;
  long lVar6;
  size_t sVar7;
  void *__src;
  reference piVar8;
  size_t sVar9;
  RTPMemoryManager *pRVar10;
  uint8_t *puVar11;
  bool bVar12;
  bool local_242;
  bool local_241;
  bool local_229;
  iterator local_200;
  _List_const_iterator<in6_addr> local_1f8;
  int local_1f0;
  int local_1ec;
  int j;
  int i_1;
  uint16_t ip16 [8];
  char str [48];
  undefined8 uStack_1a0;
  int len;
  in6_addr ip_1;
  iterator local_180;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  iterator local_170;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  const_iterator it_2;
  bool found;
  iterator local_140;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  iterator local_130;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  allocator<char> local_119;
  undefined1 local_118 [8];
  string hname_1;
  int i;
  iterator local_e8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  iterator local_d8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  const_iterator it_1;
  undefined1 local_b8 [8];
  string hname;
  undefined8 uStack_88;
  in6_addr ip;
  hostent *he;
  bool foundentry;
  iterator iStack_68;
  bool founddouble;
  _List_const_iterator<in6_addr> local_60;
  iterator local_58;
  _List_const_iterator<in6_addr> local_50;
  undefined1 local_48 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  const_iterator it;
  size_t *bufferlength_local;
  uint8_t *buffer_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    return -0x72;
  }
  if ((this->created & 1U) == 0) {
    return -0x71;
  }
  if (this->localhostname != (uint8_t *)0x0) goto LAB_0015c2da;
  bVar3 = std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::empty(&this->localIPs);
  if (bVar3) {
    return -0x6d;
  }
  std::_List_const_iterator<in6_addr>::_List_const_iterator
            ((_List_const_iterator<in6_addr> *)
             &hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_48);
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::begin(&this->localIPs);
  std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_50,&local_58);
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)local_50._M_node;
  while( true ) {
    iStack_68 = std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::end(&this->localIPs);
    std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_60,&stack0xffffffffffffff98);
    bVar3 = std::operator!=((_Self *)&hostnames.
                                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl._M_node._M_size,&local_60);
    if (!bVar3) break;
    bVar3 = false;
    bVar2 = true;
    while( true ) {
      bVar12 = false;
      if (!bVar3) {
        bVar12 = bVar2;
      }
      if (!bVar12) break;
      piVar8 = std::_List_const_iterator<in6_addr>::operator*
                         ((_List_const_iterator<in6_addr> *)
                          &hostnames.
                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl._M_node._M_size);
      uStack_88 = *(undefined8 *)&piVar8->__in6_u;
      ip.__in6_u._0_8_ = *(undefined8 *)((long)&piVar8->__in6_u + 8);
      ip.__in6_u._8_8_ = gethostbyaddr(&uStack_88,0x10,10);
      if ((hostent *)ip.__in6_u._8_8_ == (hostent *)0x0) {
        bVar2 = false;
      }
      else {
        pcVar1 = ((hostent *)ip.__in6_u._8_8_)->h_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,pcVar1,(allocator<char> *)((long)&it_1._M_node + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_c8);
        local_d8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_d0,&local_d8);
        local_c8._M_node = local_d0._M_node;
        while( true ) {
          local_229 = false;
          if (!bVar3) {
            local_e8._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48);
            std::
            _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_List_const_iterator(&local_e0,&local_e8);
            local_229 = std::operator!=(&local_c8,&local_e0);
          }
          if (local_229 == false) break;
          pbVar5 = std::
                   _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c8);
          _Var4 = std::operator==(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8);
          if (_Var4) {
            bVar3 = true;
          }
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_c8,0);
        }
        if (!bVar3) {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_48,(value_type *)local_b8);
        }
        hname_1.field_2._12_4_ = 0;
        while( true ) {
          bVar12 = false;
          if (!bVar3) {
            bVar12 = *(long *)(*(long *)(ip.__in6_u._8_8_ + 8) +
                              (long)(int)hname_1.field_2._12_4_ * 8) != 0;
          }
          if (!bVar12) break;
          pcVar1 = *(char **)(*(long *)(ip.__in6_u._8_8_ + 8) +
                             (long)(int)hname_1.field_2._12_4_ * 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_118,pcVar1,&local_119);
          std::allocator<char>::~allocator(&local_119);
          local_130._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_128,&local_130);
          local_c8._M_node = local_128._M_node;
          while( true ) {
            local_241 = false;
            if (!bVar3) {
              local_140._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_48);
              std::
              _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_List_const_iterator(&local_138,&local_140);
              local_241 = std::operator!=(&local_c8,&local_138);
            }
            if (local_241 == false) break;
            pbVar5 = std::
                     _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_c8);
            _Var4 = std::operator==(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_118);
            if (_Var4) {
              bVar3 = true;
            }
            std::
            _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_c8,0);
          }
          if (!bVar3) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48,(value_type *)local_118);
            hname_1.field_2._12_4_ = hname_1.field_2._12_4_ + 1;
          }
          std::__cxx11::string::~string((string *)local_118);
        }
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
    std::_List_const_iterator<in6_addr>::operator++
              ((_List_const_iterator<in6_addr> *)
               &hostnames.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size,0);
  }
  it_2._M_node._7_1_ = 0;
  bVar3 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
  if (!bVar3) {
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_160);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sort((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
    local_170._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_168,&local_170);
    local_160._M_node = local_168._M_node;
    while( true ) {
      local_242 = false;
      if ((it_2._M_node._7_1_ & 1) == 0) {
        local_180._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_178,&local_180);
        local_242 = std::operator!=(&local_160,&local_178);
      }
      if (local_242 == false) break;
      pbVar5 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_160);
      lVar6 = std::__cxx11::string::find((char)pbVar5,0x2e);
      if (lVar6 != -1) {
        it_2._M_node._7_1_ = 1;
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_160);
        sVar7 = std::__cxx11::string::length();
        this->localhostnamelength = sVar7;
        sVar7 = this->localhostnamelength;
        pRVar10 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        puVar11 = (uint8_t *)operator_new__(sVar7 + 1,pRVar10,0);
        this->localhostname = puVar11;
        if (this->localhostname == (uint8_t *)0x0) {
          this_local._4_4_ = -1;
          bVar3 = true;
          goto LAB_0015c2b6;
        }
        puVar11 = this->localhostname;
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_160);
        __src = (void *)std::__cxx11::string::c_str();
        memcpy(puVar11,__src,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
      }
      ip_1.__in6_u._8_8_ =
           std::
           _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator++(&local_160,0);
    }
  }
  if ((it_2._M_node._7_1_ & 1) == 0) {
    local_200._M_node =
         (_List_node_base *)
         std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::begin(&this->localIPs);
    std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_1f8,&local_200);
    hostnames.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = (size_t)local_1f8._M_node;
    piVar8 = std::_List_const_iterator<in6_addr>::operator*
                       ((_List_const_iterator<in6_addr> *)
                        &hostnames.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
    uStack_1a0 = *(undefined8 *)&piVar8->__in6_u;
    ip_1.__in6_u._0_8_ = *(undefined8 *)((long)&piVar8->__in6_u + 8);
    local_1ec = 0;
    for (local_1f0 = 0; local_1f0 < 8; local_1f0 = local_1f0 + 1) {
      *(ushort *)((long)&j + (long)local_1f0 * 2) =
           (ushort)*(byte *)((long)&stack0xfffffffffffffe60 + (long)local_1ec) << 8;
      *(ushort *)((long)&j + (long)local_1f0 * 2) =
           *(ushort *)((long)&j + (long)local_1f0 * 2) |
           (ushort)*(byte *)((long)&stack0xfffffffffffffe60 + (long)(local_1ec + 1));
      local_1ec = local_1ec + 2;
    }
    snprintf((char *)(ip16 + 4),0x30,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",(ulong)(ushort)j,
             (ulong)j._2_2_,(ulong)(ushort)i_1,(uint)i_1._2_2_,(uint)ip16[0],(uint)ip16[1],
             (uint)ip16[2],(uint)ip16[3]);
    sVar9 = strlen((char *)(ip16 + 4));
    this->localhostnamelength = (long)(int)sVar9;
    sVar7 = this->localhostnamelength;
    pRVar10 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    puVar11 = (uint8_t *)operator_new__(sVar7 + 1,pRVar10,0);
    this->localhostname = puVar11;
    if (this->localhostname != (uint8_t *)0x0) {
      memcpy(this->localhostname,ip16 + 4,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
      goto LAB_0015c2ac;
    }
    this_local._4_4_ = -1;
    bVar3 = true;
  }
  else {
LAB_0015c2ac:
    bVar3 = false;
  }
LAB_0015c2b6:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_48);
  if (bVar3) {
    return this_local._4_4_;
  }
LAB_0015c2da:
  if (*bufferlength < this->localhostnamelength) {
    *bufferlength = this->localhostnamelength;
    this_local._4_4_ = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,this->localhostnamelength);
    *bufferlength = this->localhostnamelength;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_NOLOCALIPS;
		}
		
		std::list<in6_addr>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				in6_addr ip = (*it);	
			
				he = gethostbyaddr((char *)&ip,sizeof(in6_addr),AF_INET6);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);

					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
						
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			in6_addr ip;
			int len;
			char str[48];
			uint16_t ip16[8];
			int i,j;
				
			it = localIPs.begin();
			ip = (*it);
			
			for (i = 0,j = 0 ; j < 8 ; j++,i += 2)
			{
				ip16[j] = (((uint16_t)ip.s6_addr[i])<<8);
				ip16[j] |= ((uint16_t)ip.s6_addr[i+1]);
			}			
			
			RTP_SNPRINTF(str,48,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",(int)ip16[0],(int)ip16[1],(int)ip16[2],(int)ip16[3],(int)ip16[4],(int)ip16[5],(int)ip16[6],(int)ip16[7]);
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}